

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<double>::make_l1_norm(default_cost_type<double> *this,int n)

{
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (n != 0) {
    auVar19._8_8_ = 0x7fffffffffffffff;
    auVar19._0_8_ = 0x7fffffffffffffff;
    dVar17 = 0.0;
    uVar11 = 0;
    do {
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar11];
      uVar11 = uVar11 + 1;
      auVar20 = vandpd_avx(auVar20,auVar19);
      dVar17 = dVar17 + auVar20._0_8_;
    } while ((uint)n != uVar11);
    dVar12 = ABS(dVar17);
    if (((long)dVar12 < 0x7ff0000000000001 && n != 0) &&
        (0xffffffffffffe < (long)dVar12 - 1U && (dVar17 != 0.0 && dVar12 != INFINITY))) {
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pdVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar17;
      auVar14 = vbroadcastsd_avx512f(auVar18);
      auVar15 = vpbroadcastq_avx512f();
      uVar11 = 0;
      do {
        auVar16 = vpbroadcastq_avx512f();
        auVar16 = vporq_avx512f(auVar16,auVar13);
        uVar10 = vpcmpuq_avx512f(auVar16,auVar15,2);
        pdVar1 = pdVar2 + uVar11;
        auVar16._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * (long)pdVar1[1];
        auVar16._0_8_ = (ulong)((byte)uVar10 & 1) * (long)*pdVar1;
        auVar16._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * (long)pdVar1[2];
        auVar16._24_8_ = (ulong)((byte)(uVar10 >> 3) & 1) * (long)pdVar1[3];
        auVar16._32_8_ = (ulong)((byte)(uVar10 >> 4) & 1) * (long)pdVar1[4];
        auVar16._40_8_ = (ulong)((byte)(uVar10 >> 5) & 1) * (long)pdVar1[5];
        auVar16._48_8_ = (ulong)((byte)(uVar10 >> 6) & 1) * (long)pdVar1[6];
        auVar16._56_8_ = (uVar10 >> 7) * (long)pdVar1[7];
        auVar16 = vdivpd_avx512f(auVar16,auVar14);
        pdVar1 = pdVar2 + uVar11;
        bVar3 = (bool)((byte)uVar10 & 1);
        bVar4 = (bool)((byte)(uVar10 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar10 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar10 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar10 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar10 >> 6) & 1);
        *pdVar1 = (double)((ulong)bVar3 * auVar16._0_8_ | (ulong)!bVar3 * (long)*pdVar1);
        pdVar1[1] = (double)((ulong)bVar4 * auVar16._8_8_ | (ulong)!bVar4 * (long)pdVar1[1]);
        pdVar1[2] = (double)((ulong)bVar5 * auVar16._16_8_ | (ulong)!bVar5 * (long)pdVar1[2]);
        pdVar1[3] = (double)((ulong)bVar6 * auVar16._24_8_ | (ulong)!bVar6 * (long)pdVar1[3]);
        pdVar1[4] = (double)((ulong)bVar7 * auVar16._32_8_ | (ulong)!bVar7 * (long)pdVar1[4]);
        pdVar1[5] = (double)((ulong)bVar8 * auVar16._40_8_ | (ulong)!bVar8 * (long)pdVar1[5]);
        pdVar1[6] = (double)((ulong)bVar9 * auVar16._48_8_ | (ulong)!bVar9 * (long)pdVar1[6]);
        pdVar1[7] = (double)((uVar10 >> 7) * auVar16._56_8_ |
                            (ulong)!SUB81(uVar10 >> 7,0) * (long)pdVar1[7]);
        uVar11 = uVar11 + 8;
      } while (((ulong)(uint)n + 7 & 0xfffffffffffffff8) != uVar11);
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }